

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O3

int __thiscall ncnn::Deconvolution_x86::create_pipeline(Deconvolution_x86 *this,Option *opt)

{
  _func_int **pp_Var1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  _func_int *p_Var6;
  long lVar7;
  int _w;
  ulong uVar8;
  undefined4 *puVar9;
  int k;
  int _h;
  ulong uVar10;
  undefined4 *puVar11;
  undefined4 *puVar12;
  undefined4 *puVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined4 *puVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  int i;
  ulong uVar22;
  Mat local_c0;
  Mat local_78;
  
  p_Var6 = this->_vptr_Deconvolution_x86[-3];
  uVar8 = (long)*(int *)(&this->field_0xd8 + (long)p_Var6) *
          (long)*(int *)(&this->field_0xd4 + (long)p_Var6);
  _w = (int)uVar8;
  uVar17 = (long)*(int *)(&this->field_0x110 + (long)p_Var6) / (long)_w;
  uVar17 = (long)((ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff) /
           (long)*(int *)(&this->field_0xd0 + (long)p_Var6);
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  iVar19 = 0;
  Mat::create(&local_78,*(int *)(&this->field_0x18c + (long)p_Var6),4,(Allocator *)0x0);
  pp_Var1 = this->_vptr_Deconvolution_x86;
  p_Var6 = pp_Var1[-3];
  uVar14 = *(uint *)(&this->field_0xd0 + (long)p_Var6);
  _h = (int)uVar17;
  if (0 < (int)(uVar14 * _h)) {
    lVar7 = *(long *)(&this->field_0x160 + (long)p_Var6);
    puVar11 = (undefined4 *)((long)local_78.data + uVar8 * 4 + -4);
    do {
      if (0 < _w) {
        uVar15 = 0;
        puVar18 = puVar11;
        do {
          *puVar18 = *(undefined4 *)(lVar7 + uVar15 * 4);
          uVar15 = uVar15 + 1;
          puVar18 = puVar18 + -1;
        } while ((uVar8 & 0xffffffff) != uVar15);
        p_Var6 = pp_Var1[-3];
      }
      iVar19 = iVar19 + 1;
      uVar14 = *(uint *)(&this->field_0xd0 + (long)p_Var6);
      lVar7 = lVar7 + uVar8 * 4;
      puVar11 = puVar11 + uVar8;
    } while (iVar19 < (int)(uVar14 * _h));
  }
  uVar21 = 1;
  uVar15 = 1;
  if (opt->use_packing_layout != false) {
    uVar21 = (ulong)((uint)((uVar17 & 3) == 0) * 3 + 1);
    uVar15 = (ulong)((uint)((uVar14 & 3) == 0) * 3 + 1);
  }
  Mat::reshape(&local_c0,&local_78,_w,_h,*(int *)(&this->field_0xd0 + (long)p_Var6),(Allocator *)0x0
              );
  iVar20 = (int)uVar21;
  iVar19 = (int)uVar15;
  Mat::create(&this->weight_data_tm,_w,
              (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar17 & 0xffffffff) / (long)iVar20),
              *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86[-3]) / iVar19,
              (ulong)(uint)(iVar19 * iVar20 * 4),iVar19 * iVar20,(Allocator *)0x0);
  pp_Var1 = this->_vptr_Deconvolution_x86;
  p_Var6 = pp_Var1[-3];
  if (iVar19 <= *(int *)(&this->field_0xd0 + (long)p_Var6)) {
    pvVar2 = (this->weight_data_tm).data;
    sVar3 = (this->weight_data_tm).cstep;
    sVar4 = (this->weight_data_tm).elemsize;
    uVar17 = 0;
    do {
      if (iVar20 <= _h) {
        puVar11 = (undefined4 *)(((uVar17 & 0xffffffff) / uVar15) * sVar3 * sVar4 + (long)pvVar2);
        puVar18 = (undefined4 *)(local_c0.cstep * local_c0.elemsize * uVar17 + (long)local_c0.data);
        lVar7 = 0;
        do {
          if (0 < _w) {
            uVar10 = 0;
            puVar9 = puVar18;
            do {
              uVar22 = 0;
              puVar13 = puVar9;
              uVar16 = uVar15;
              puVar12 = puVar9;
              do {
                do {
                  *puVar11 = *puVar13;
                  puVar11 = puVar11 + 1;
                  uVar16 = uVar16 - 1;
                  puVar13 = (undefined4 *)((long)puVar13 + local_c0.cstep * local_c0.elemsize);
                } while (uVar16 != 0);
                uVar22 = uVar22 + 1;
                puVar13 = (undefined4 *)((long)puVar12 + (long)local_c0.w * local_c0.elemsize);
                uVar16 = uVar15;
                puVar12 = puVar13;
              } while (uVar22 != uVar21);
              uVar10 = uVar10 + 1;
              puVar9 = puVar9 + 1;
            } while (uVar10 != (uVar8 & 0xffffffff));
          }
          lVar7 = lVar7 + uVar21;
          puVar18 = (undefined4 *)((long)puVar18 + (long)local_c0.w * local_c0.elemsize * uVar21);
        } while (lVar7 < (long)((long)_h - (ulong)(iVar20 - 1)));
        p_Var6 = pp_Var1[-3];
      }
      uVar17 = uVar17 + uVar15;
    } while ((long)(uVar17 + (iVar19 - 1)) < (long)*(int *)(&this->field_0xd0 + (long)p_Var6));
  }
  if (local_c0.refcount != (int *)0x0) {
    LOCK();
    *local_c0.refcount = *local_c0.refcount + -1;
    UNLOCK();
    if (*local_c0.refcount == 0) {
      if (local_c0.allocator == (Allocator *)0x0) {
        if (local_c0.data != (void *)0x0) {
          free(local_c0.data);
        }
      }
      else {
        (*(local_c0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (opt->lightmode != false) {
    p_Var6 = this->_vptr_Deconvolution_x86[-3];
    piVar5 = *(int **)(&this->field_0x168 + (long)p_Var6);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (*(long **)(&this->field_0x180 + (long)p_Var6) == (long *)0x0) {
          if (*(void **)(&this->field_0x160 + (long)p_Var6) != (void *)0x0) {
            free(*(void **)(&this->field_0x160 + (long)p_Var6));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x180 + (long)p_Var6) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var6) = 0;
    *(undefined8 *)(&this->field_0x16c + (long)p_Var6) = 0;
    *(undefined8 *)(&this->field_0x174 + (long)p_Var6) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var6) = 0;
    *(undefined8 *)(&this->field_0x168 + (long)p_Var6) = 0;
    *(undefined8 *)(&this->field_0x188 + (long)p_Var6) = 0;
    *(undefined8 *)(&this->field_0x190 + (long)p_Var6) = 0;
    *(undefined4 *)(&this->field_0x198 + (long)p_Var6) = 0;
  }
  piVar5 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int Deconvolution_x86::create_pipeline(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int num_input = weight_data_size / maxk / num_output;

    Mat weight_data_transposed(weight_data.w);
    {
        float* pt = weight_data_transposed;
        const float* p = weight_data;

        for (int i = 0; i < num_input * num_output; i++)
        {
            for (int k = 0; k < maxk; k++)
            {
                pt[maxk - 1 - k] = p[k];
            }

            p += maxk;
            pt += maxk;
        }
    }

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-kh-inch-outch
    // dst = pb-pa-kw-kh-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data_transposed.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}